

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaDAG.cpp
# Opt level: O2

void __thiscall MatryoshkaDAG::computeTopK(MatryoshkaDAG *this)

{
  undefined8 *puVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  const_reference pvVar5;
  double *pdVar6;
  double *pdVar7;
  size_t k;
  size_t *k_00;
  long lVar8;
  long lVar9;
  ulong uVar10;
  size_t *local_d0;
  anon_class_16_2_fd512dd9 pushSubProblem;
  value_type nonDomainCandidate;
  heapT heapOPTNonDomain;
  heapT heapOPTDomain;
  
  local_d0 = (size_t *)0x2;
  while( true ) {
    if ((size_t *)this->params->n < local_d0) break;
    heapOPTNonDomain.trees.super_type.data_.root_plus_size_.super_size_traits.size_ = 0;
    heapOPTNonDomain.super_type.super_base_type.super_size_holder<true,_unsigned_long>.size_ =
         (base_type)(size_holder<true,_unsigned_long>)0x0;
    heapOPTNonDomain.top_element = (node_pointer)0x0;
    heapOPTNonDomain.trees.super_type.data_.root_plus_size_.m_header.super_node.next_ =
         &heapOPTNonDomain.trees.super_type.data_.root_plus_size_.m_header.super_node;
    heapOPTDomain.super_type.super_base_type.super_size_holder<true,_unsigned_long>.size_ =
         (base_type)(size_holder<true,_unsigned_long>)0x0;
    heapOPTDomain.top_element = (node_pointer)0x0;
    heapOPTDomain.trees.super_type.data_.root_plus_size_.super_size_traits.size_ = 0;
    heapOPTDomain.trees.super_type.data_.root_plus_size_.m_header.super_node.next_ =
         &heapOPTDomain.trees.super_type.data_.root_plus_size_.m_header.super_node;
    lVar8 = 0;
    heapOPTNonDomain.trees.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
         heapOPTNonDomain.trees.super_type.data_.root_plus_size_.m_header.super_node.next_;
    heapOPTDomain.trees.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
         heapOPTDomain.trees.super_type.data_.root_plus_size_.m_header.super_node.next_;
    for (k_00 = (size_t *)0x1; k_00 < local_d0; k_00 = (size_t *)((long)k_00 + 1)) {
      pdVar7 = *(double **)
                ((long)&(((this->OPTD).
                          super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                        )._M_impl.super__Vector_impl_data + lVar8);
      nonDomainCandidate.score = *pdVar7;
      nonDomainCandidate.backOptimalIndex = (size_t)pdVar7[2];
      nonDomainCandidate.backPointer = (size_t)k_00;
      boost::heap::
      binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
      ::push(&heapOPTNonDomain,&nonDomainCandidate);
      puVar1 = *(undefined8 **)
                ((long)&(((this->OPT).
                          super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                        )._M_impl.super__Vector_impl_data + lVar8);
      pushSubProblem.this = (MatryoshkaDAG *)*puVar1;
      pushSubProblem.l = (size_t *)puVar1[1];
      dVar3 = q(this,(size_t)k_00,(size_t)local_d0);
      pushSubProblem.this = (MatryoshkaDAG *)(dVar3 + (double)pushSubProblem.this);
      pushSubProblem.l = k_00;
      boost::heap::
      binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
      ::push(&heapOPTDomain,(value_type *)&pushSubProblem);
      lVar8 = lVar8 + 0x18;
    }
    pushSubProblem.l = (size_t *)&local_d0;
    lVar8 = 0;
    lVar9 = 0;
    pushSubProblem.this = this;
    for (uVar10 = 0; uVar10 < this->params->K; uVar10 = uVar10 + 1) {
      pvVar5 = boost::heap::
               binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
               ::top(&heapOPTDomain);
      lVar2 = *(long *)&(this->OPTD).
                        super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)local_d0].
                        super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                        ._M_impl.super__Vector_impl_data;
      dVar3 = (double)pvVar5->backPointer;
      pdVar7 = (double *)(lVar2 + lVar8);
      *pdVar7 = pvVar5->score;
      pdVar7[1] = dVar3;
      *(size_t *)(lVar2 + 0x10 + lVar8) = pvVar5->backOptimalIndex;
      computeTopK::anon_class_16_2_fd512dd9::operator()
                (&pushSubProblem,&heapOPTDomain,
                 (SubProblem *)
                 (*(long *)&(this->OPTD).
                            super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)local_d0].
                            super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                            ._M_impl.super__Vector_impl_data + lVar8),true);
      pvVar5 = boost::heap::
               binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
               ::top(&heapOPTNonDomain);
      nonDomainCandidate.score = pvVar5->score;
      nonDomainCandidate.backPointer = pvVar5->backPointer;
      nonDomainCandidate.backOptimalIndex = pvVar5->backOptimalIndex;
      lVar2 = *(long *)&(this->OPTD).
                        super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)local_d0].
                        super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                        ._M_impl.super__Vector_impl_data;
      pdVar6 = (double *)
               (*(long *)&(this->OPT).
                          super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)local_d0].
                          super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                          ._M_impl.super__Vector_impl_data + lVar8);
      pdVar7 = (double *)(lVar2 + lVar9 * 0x18);
      if (nonDomainCandidate.score < *pdVar7 || nonDomainCandidate.score == *pdVar7) {
        pdVar7 = (double *)(lVar2 + lVar9 * 0x18);
        pdVar6[2] = pdVar7[2];
        dVar3 = pdVar7[1];
        *pdVar6 = *pdVar7;
        pdVar6[1] = dVar3;
        lVar9 = lVar9 + 1;
      }
      else {
        dVar3 = pvVar5->score;
        dVar4 = (double)pvVar5->backPointer;
        pdVar6[2] = (double)pvVar5->backOptimalIndex;
        *pdVar6 = dVar3;
        pdVar6[1] = dVar4;
        computeTopK::anon_class_16_2_fd512dd9::operator()
                  (&pushSubProblem,&heapOPTNonDomain,&nonDomainCandidate,false);
      }
      lVar8 = lVar8 + 0x18;
    }
    boost::heap::
    binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
    ::~binomial_heap(&heapOPTDomain);
    boost::heap::
    binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
    ::~binomial_heap(&heapOPTNonDomain);
    local_d0 = (size_t *)((long)local_d0 + 1);
  }
  return;
}

Assistant:

void MatryoshkaDAG::computeTopK() {
    //std::cerr << "begin computeTopK()\n";
    for (size_t l=2; l<=params->n; l++) {
        /*
        
        OPT(l) = max{  max_{ k<l } OPTD(k-1),  // OPT(l) ends in a non-domain
                       OPTD(l) }               // OPT(l) ends in a domain
        
        OPTD(l) = max_{ k<l } OPT(k-1) + q(k,l)
        
        */
        using heapT = boost::heap::binomial_heap<SubProblem>;
        heapT heapOPTNonDomain;
        heapT heapOPTDomain;

        for (size_t k=1; k<l; k++) {
            auto nonDomainCandidate = OPTD[k-1][0];
            nonDomainCandidate.backPointer = k;
            heapOPTNonDomain.push(nonDomainCandidate); 

            auto domainCandidate = OPT[k-1][0];
            domainCandidate.score += q(k,l);
            domainCandidate.backPointer = k;
            heapOPTDomain.push(domainCandidate);
        }

        auto pushSubProblem = [&](heapT & heap, SubProblem & subProb, bool isDomain) {
            heap.pop();
            auto nextOptimalIndex = subProb.backOptimalIndex + 1;
            auto k = subProb.backPointer;

            if (nextOptimalIndex < params->K) {
                SubProblem newCandidate;
                if (isDomain) {
                    newCandidate = OPT[k-1][nextOptimalIndex];
                    newCandidate.score += q(k,l);
                } else {
                    newCandidate = OPTD[k-1][nextOptimalIndex];
                }
                newCandidate.backPointer = k;
                newCandidate.backOptimalIndex = nextOptimalIndex;
                heap.push(newCandidate);
            }
        };

        size_t i = 0;
        size_t j = 0;
        while (i < params->K) {
            OPTD[l][i] = heapOPTDomain.top();
            pushSubProblem(heapOPTDomain, OPTD[l][i], true);
            auto nonDomainCandidate = heapOPTNonDomain.top();
             
            if (nonDomainCandidate.score > OPTD[l][j].score) {
                OPT[l][i] = nonDomainCandidate;
                pushSubProblem(heapOPTNonDomain, nonDomainCandidate, false);
            } else {
                OPT[l][i] = OPTD[l][j];
                j++;
            }

            i++;    
        }
    }

    /*std::cerr << "In topK()\n";
    for (size_t i = 0; i < params->K; ++i) {
        std::cerr << "The " << i << "th-best solution had score " << OPT[params->n][i].score << "\n";
    }*/
}